

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell_00;
  double local_128;
  double local_118;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL quality3;
  REF_DBL quality2;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_INT node3;
  REF_INT node2;
  REF_INT nodes [27];
  REF_INT local_44;
  REF_INT local_40;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  unique0x00012000 = ref_grid->node;
  *allowed = 0;
  ref_grid_local._4_4_ =
       ref_swap_node23(ref_grid,node0,node1,(REF_INT *)((long)&quality0 + 4),(REF_INT *)&quality0);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_cell_list_with2(ref_cell_00,node0,node1,2,cell_to_swap,&local_44);
    if (ref_grid_local._4_4_ == 0) {
      if ((long)cell_to_swap[0] == 2) {
        ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,local_44,&node3);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_node_tri_quality(stack0xffffffffffffffc8,&node3,&quality1);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,local_40,&node3);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_node_tri_quality(stack0xffffffffffffffc8,&node3,&quality2);
              if (ref_grid_local._4_4_ == 0) {
                node2 = quality0._0_4_;
                nodes[0] = quality0._4_4_;
                node3 = node0;
                ref_grid_local._4_4_ =
                     ref_node_tri_quality(stack0xffffffffffffffc8,&node3,&quality3);
                if (ref_grid_local._4_4_ == 0) {
                  node2 = quality0._4_4_;
                  nodes[0] = quality0._0_4_;
                  node3 = node1;
                  ref_grid_local._4_4_ =
                       ref_node_tri_quality
                                 (stack0xffffffffffffffc8,&node3,
                                  (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (ref_grid_local._4_4_ == 0) {
                    if (_ref_private_macro_code_rss_1 <= quality3) {
                      local_118 = _ref_private_macro_code_rss_1;
                    }
                    else {
                      local_118 = quality3;
                    }
                    if (quality2 <= quality1) {
                      local_128 = quality2;
                    }
                    else {
                      local_128 = quality1;
                    }
                    if (local_128 <= local_118) {
                      *allowed = 1;
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      *allowed = 0;
                      ref_grid_local._4_4_ = 0;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x29d,"ref_swap_quality",(ulong)ref_grid_local._4_4_,"qual");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x299,"ref_swap_quality",(ulong)ref_grid_local._4_4_,"qual");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0x295,"ref_swap_quality",(ulong)ref_grid_local._4_4_,"qual");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x294,"ref_swap_quality",(ulong)ref_grid_local._4_4_,"nodes tri1");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x293,"ref_swap_quality",(ulong)ref_grid_local._4_4_,"qual");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x292,"ref_swap_quality",(ulong)ref_grid_local._4_4_,"nodes tri0");
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x290,"ref_swap_quality","there should be two triangles for manifold",2,
               (long)cell_to_swap[0]);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x28f,
             "ref_swap_quality",(ulong)ref_grid_local._4_4_,"more then two");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x28c,
           "ref_swap_quality",(ulong)ref_grid_local._4_4_,"other nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_quality(REF_GRID ref_grid, REF_INT node0,
                                    REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_DBL quality0, quality1, quality2, quality3;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_node_tri_quality(ref_node, nodes, &quality0), "qual");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  RSS(ref_node_tri_quality(ref_node, nodes, &quality1), "qual");
  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_node_tri_quality(ref_node, nodes, &quality2), "qual");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_node_tri_quality(ref_node, nodes, &quality3), "qual");

  if (MIN(quality2, quality3) < MIN(quality0, quality1)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  *allowed = REF_TRUE;
  return REF_SUCCESS;
}